

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.h
# Opt level: O0

string * __thiscall libsgp4::Tle::ToString_abi_cxx11_(string *__return_storage_ptr__,Tle *this)

{
  uint uVar1;
  _Setprecision _Var2;
  _Setw _Var3;
  void *pvVar4;
  ostream *poVar5;
  double dVar6;
  DateTime local_1d8;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  Tle *local_18;
  Tle *this_local;
  
  local_18 = this;
  this_local = (Tle *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  pvVar4 = (void *)std::ostream::operator<<(local_190,std::right);
  std::ostream::operator<<(pvVar4,std::fixed);
  poVar5 = std::operator<<(local_190,"Norad Number:         ");
  uVar1 = NoradNumber(this);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,uVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_190,"Int. Designator:      ");
  IntDesignator_abi_cxx11_(&local_1d0,this);
  poVar5 = std::operator<<(poVar5,(string *)&local_1d0);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar5 = std::operator<<(local_190,"Epoch:                ");
  local_1d8 = Epoch(this);
  poVar5 = operator<<(poVar5,&local_1d8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_190,"Orbit Number:         ");
  uVar1 = OrbitNumber(this);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,uVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  _Var2 = std::setprecision(8);
  std::operator<<(local_190,_Var2);
  std::operator<<(local_190,"Mean Motion Dt2:      ");
  _Var3 = std::setw(0xc);
  poVar5 = std::operator<<(local_190,_Var3);
  dVar6 = MeanMotionDt2(this);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,dVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_190,"Mean Motion Ddt6:     ");
  _Var3 = std::setw(0xc);
  poVar5 = std::operator<<(local_190,_Var3);
  dVar6 = MeanMotionDdt6(this);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,dVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_190,"Eccentricity:         ");
  _Var3 = std::setw(0xc);
  poVar5 = std::operator<<(local_190,_Var3);
  dVar6 = Eccentricity(this);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,dVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_190,"BStar:                ");
  _Var3 = std::setw(0xc);
  poVar5 = std::operator<<(local_190,_Var3);
  dVar6 = BStar(this);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,dVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_190,"Inclination:          ");
  _Var3 = std::setw(0xc);
  poVar5 = std::operator<<(local_190,_Var3);
  dVar6 = Inclination(this,true);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,dVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_190,"Right Ascending Node: ");
  _Var3 = std::setw(0xc);
  poVar5 = std::operator<<(local_190,_Var3);
  dVar6 = RightAscendingNode(this,true);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,dVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_190,"Argument Perigee:     ");
  _Var3 = std::setw(0xc);
  poVar5 = std::operator<<(local_190,_Var3);
  dVar6 = ArgumentPerigee(this,true);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,dVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_190,"Mean Anomaly:         ");
  _Var3 = std::setw(0xc);
  poVar5 = std::operator<<(local_190,_Var3);
  dVar6 = MeanAnomaly(this,true);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,dVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_190,"Mean Motion:          ");
  _Var3 = std::setw(0xc);
  poVar5 = std::operator<<(local_190,_Var3);
  dVar6 = MeanMotion(this);
  pvVar4 = (void *)std::ostream::operator<<(poVar5,dVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;
        ss << std::right << std::fixed;
        ss << "Norad Number:         " << NoradNumber() << std::endl;
        ss << "Int. Designator:      " << IntDesignator() << std::endl;
        ss << "Epoch:                " << Epoch() << std::endl;
        ss << "Orbit Number:         " << OrbitNumber() << std::endl;
        ss << std::setprecision(8);
        ss << "Mean Motion Dt2:      ";
        ss << std::setw(12) << MeanMotionDt2() << std::endl;
        ss << "Mean Motion Ddt6:     ";
        ss << std::setw(12) << MeanMotionDdt6() << std::endl;
        ss << "Eccentricity:         ";
        ss << std::setw(12) << Eccentricity() << std::endl;
        ss << "BStar:                ";
        ss << std::setw(12) << BStar() << std::endl;
        ss << "Inclination:          ";
        ss << std::setw(12) << Inclination(true) << std::endl;
        ss << "Right Ascending Node: ";
        ss << std::setw(12) << RightAscendingNode(true) << std::endl;
        ss << "Argument Perigee:     ";
        ss << std::setw(12) << ArgumentPerigee(true) << std::endl;
        ss << "Mean Anomaly:         ";
        ss << std::setw(12) << MeanAnomaly(true) << std::endl;
        ss << "Mean Motion:          ";
        ss << std::setw(12) << MeanMotion() << std::endl;
        return ss.str();
    }